

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strcase.c
# Opt level: O3

int Curl_strncasecompare(char *first,char *second,size_t max)

{
  char cVar1;
  uint uVar2;
  char cVar3;
  char cVar4;
  char *pcVar5;
  byte bVar6;
  char cVar7;
  byte bVar8;
  char cVar9;
  char cVar10;
  
  cVar1 = *first;
  if (cVar1 != '\0') {
    pcVar5 = first + 1;
    do {
      cVar3 = *second;
      if ((cVar3 == '\0') || (max == 0)) goto LAB_0012ac55;
      bVar6 = cVar1 + 0x9f;
      cVar7 = cVar1 + -0x20;
      cVar4 = cVar7;
      if (0x19 < bVar6) {
        cVar4 = cVar1;
      }
      bVar8 = cVar3 + 0x9f;
      cVar9 = cVar3 + -0x20;
      cVar10 = cVar9;
      if (0x19 < bVar8) {
        cVar10 = cVar3;
      }
      if (cVar4 != cVar10) goto LAB_0012ac6c;
      max = max - 1;
      second = second + 1;
      cVar1 = *pcVar5;
      pcVar5 = pcVar5 + 1;
    } while (cVar1 != '\0');
  }
  cVar1 = '\0';
LAB_0012ac55:
  if (max == 0) {
    uVar2 = 1;
  }
  else {
    cVar3 = *second;
    bVar6 = cVar1 + 0x9f;
    cVar7 = cVar1 + -0x20;
    bVar8 = cVar3 + 0x9f;
    cVar9 = cVar3 + -0x20;
LAB_0012ac6c:
    if (bVar6 < 0x1a) {
      cVar1 = cVar7;
    }
    if (bVar8 < 0x1a) {
      cVar3 = cVar9;
    }
    uVar2 = (uint)(cVar1 == cVar3);
  }
  return uVar2;
}

Assistant:

int Curl_strncasecompare(const char *first, const char *second, size_t max)
{
  while(*first && *second && max) {
    if(Curl_raw_toupper(*first) != Curl_raw_toupper(*second)) {
      break;
    }
    max--;
    first++;
    second++;
  }
  if(0 == max)
    return 1; /* they are equal this far */

  return Curl_raw_toupper(*first) == Curl_raw_toupper(*second);
}